

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer-from-check.c
# Opt level: O2

void timer_cb(uv_timer_t *handle)

{
  if (handle == &timer) {
    uv_walk(timer.loop,walk_cb,magic_cookie);
    uv_close(&timer,0);
    return;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-walk-handles.c"
          ,0x2d,"handle","==","&timer",handle,"==",&timer);
  abort();
}

Assistant:

static void timer_cb(uv_timer_t* handle) {
  ASSERT_OK(uv_timer_stop(&timer_handle));
  ASSERT_EQ(1, prepare_cb_called);
  ASSERT_EQ(1, check_cb_called);
  ASSERT_OK(timer_cb_called);
  timer_cb_called++;
}